

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

RenderPassGLImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::RenderPassGLImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (void *this,RenderDeviceGLImpl **CtorArgs,RenderPassDesc *CtorArgs_1)

{
  RenderDeviceGLImpl **ppRVar1;
  undefined8 local_38;
  RenderPassGLImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  RenderPassDesc *CtorArgs_local_1;
  RenderDeviceGLImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::RenderPassGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppRVar1 = CtorArgs;
  if (*(long *)((long)this + 8) == 0) {
    pObj = (RenderPassGLImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (RenderPassGLImpl *)(**(code **)(**(long **)((long)this + 8) + 0x18))();
  }
  if (*this == 0) {
    local_38 = (RenderPassGLImpl *)
               RefCountedObject<Diligent::IRenderPass>::operator_new
                         ((RefCountedObject<Diligent::IRenderPass> *)0x88,(size_t)ppRVar1);
    RenderPassGLImpl::RenderPassGLImpl(local_38,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1);
  }
  else {
    local_38 = (RenderPassGLImpl *)
               new<Diligent::FixedBlockMemoryAllocator>
                         (0x88,*this,*(Char **)((long)this + 0x10),*(char **)((long)this + 0x18),
                          *(Int32 *)((long)this + 0x20));
    RenderPassGLImpl::RenderPassGLImpl(local_38,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::RenderPassGLImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_38,*this);
  }
  return local_38;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }